

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O1

bool __thiscall
glslang::TOutputTraverser::visitLoop(TOutputTraverser *this,TVisit param_1,TIntermLoop *node)

{
  int *piVar1;
  TInfoSink *infoSink;
  int depth;
  TInfoSinkBase *this_00;
  
  infoSink = this->infoSink;
  OutputTreeText(infoSink,&node->super_TIntermNode,(this->super_TIntermTraverser).depth);
  this_00 = &infoSink->debug;
  TInfoSinkBase::append(this_00,"Loop with condition ");
  if (node->first == false) {
    TInfoSinkBase::append(this_00,"not ");
  }
  TInfoSinkBase::append(this_00,"tested first");
  if (node->unroll == true) {
    TInfoSinkBase::append(this_00,": Unroll");
  }
  if (node->dontUnroll == true) {
    TInfoSinkBase::append(this_00,": DontUnroll");
  }
  if (node->dependency != 0) {
    TInfoSinkBase::append(this_00,": Dependency ");
    TInfoSinkBase::operator<<(this_00,node->dependency);
  }
  TInfoSinkBase::append(this_00,"\n");
  depth = (this->super_TIntermTraverser).depth + 1;
  (this->super_TIntermTraverser).depth = depth;
  OutputTreeText(this->infoSink,&node->super_TIntermNode,depth);
  if (node->test == (TIntermTyped *)0x0) {
    TInfoSinkBase::append(this_00,"No loop condition\n");
  }
  else {
    TInfoSinkBase::append(this_00,"Loop Condition\n");
    (*(node->test->super_TIntermNode)._vptr_TIntermNode[2])(node->test,this);
  }
  OutputTreeText(this->infoSink,&node->super_TIntermNode,(this->super_TIntermTraverser).depth);
  if (node->body == (TIntermNode *)0x0) {
    TInfoSinkBase::append(this_00,"No loop body\n");
  }
  else {
    TInfoSinkBase::append(this_00,"Loop Body\n");
    (*node->body->_vptr_TIntermNode[2])(node->body,this);
  }
  if (node->terminal != (TIntermTyped *)0x0) {
    OutputTreeText(this->infoSink,&node->super_TIntermNode,(this->super_TIntermTraverser).depth);
    TInfoSinkBase::append(this_00,"Loop Terminal Expression\n");
    (*(node->terminal->super_TIntermNode)._vptr_TIntermNode[2])(node->terminal,this);
  }
  piVar1 = &(this->super_TIntermTraverser).depth;
  *piVar1 = *piVar1 + -1;
  return false;
}

Assistant:

bool TOutputTraverser::visitLoop(TVisit /* visit */, TIntermLoop* node)
{
    TInfoSink& out = infoSink;

    OutputTreeText(out, node, depth);

    out.debug << "Loop with condition ";
    if (! node->testFirst())
        out.debug << "not ";
    out.debug << "tested first";

    if (node->getUnroll())
        out.debug << ": Unroll";
    if (node->getDontUnroll())
        out.debug << ": DontUnroll";
    if (node->getLoopDependency()) {
        out.debug << ": Dependency ";
        out.debug << node->getLoopDependency();
    }
    out.debug << "\n";

    ++depth;

    OutputTreeText(infoSink, node, depth);
    if (node->getTest()) {
        out.debug << "Loop Condition\n";
        node->getTest()->traverse(this);
    } else
        out.debug << "No loop condition\n";

    OutputTreeText(infoSink, node, depth);
    if (node->getBody()) {
        out.debug << "Loop Body\n";
        node->getBody()->traverse(this);
    } else
        out.debug << "No loop body\n";

    if (node->getTerminal()) {
        OutputTreeText(infoSink, node, depth);
        out.debug << "Loop Terminal Expression\n";
        node->getTerminal()->traverse(this);
    }

    --depth;

    return false;
}